

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> * __thiscall
GLRState::statesOnInput
          (set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>
           *__return_storage_ptr__,GLRState *this,string *input)

{
  bool bVar1;
  __type _Var2;
  reference ppGVar3;
  string *__lhs;
  GLRState *local_60 [3];
  GLRTransition *local_48;
  GLRTransition *state;
  iterator __end1;
  iterator __begin1;
  set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_> *__range1;
  string *input_local;
  GLRState *this_local;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *statesOnInp;
  
  std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::set
            (__return_storage_ptr__);
  __end1 = std::set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>::
           begin(&this->statesTo);
  state = (GLRTransition *)
          std::set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>::
          end(&this->statesTo);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&state), bVar1) {
    ppGVar3 = std::_Rb_tree_const_iterator<GLRTransition_*>::operator*(&__end1);
    local_48 = *ppGVar3;
    __lhs = GLRTransition::getLabel_abi_cxx11_(local_48);
    _Var2 = std::operator==(__lhs,input);
    if (_Var2) {
      local_60[0] = GLRTransition::getStateTo(local_48);
      std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::insert
                (__return_storage_ptr__,local_60);
    }
    std::_Rb_tree_const_iterator<GLRTransition_*>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<GLRState *> GLRState::statesOnInput(const std::string &input) {
    std::set<GLRState *> statesOnInp;
    for (GLRTransition *state: statesTo) {
        if (state->getLabel() == input) {
            statesOnInp.insert(state->getStateTo());
        }
    }
    return statesOnInp;
}